

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

bool kratos::MixedAssignmentVisitor::has_non_port(Generator *context,Var *var)

{
  bool bVar1;
  VarType VVar2;
  int iVar3;
  undefined4 extraout_var;
  bool local_59;
  long local_58;
  bool local_41;
  long local_40;
  VarSlice *slice;
  Expr *expr;
  Var *var_local;
  Generator *context_local;
  
  if (var == (Var *)0x0) {
    context_local._7_1_ = false;
  }
  else {
    VVar2 = Var::type(var);
    if (VVar2 == Expression) {
      if (var == (Var *)0x0) {
        local_40 = 0;
      }
      else {
        local_40 = __dynamic_cast(var,&Var::typeinfo,&Expr::typeinfo,0);
      }
      bVar1 = has_non_port(context,*(Var **)(local_40 + 0x278));
      local_41 = true;
      if (!bVar1) {
        local_41 = has_non_port(context,*(Var **)(local_40 + 0x280));
      }
      context_local._7_1_ = local_41;
    }
    else {
      VVar2 = Var::type(var);
      if (VVar2 == Slice) {
        if (var == (Var *)0x0) {
          local_58 = 0;
        }
        else {
          local_58 = __dynamic_cast(var,&Var::typeinfo,&VarSlice::typeinfo,0);
        }
        context_local._7_1_ = has_non_port(context,*(Var **)(local_58 + 0x270));
      }
      else {
        iVar3 = (*(var->super_IRNode)._vptr_IRNode[0xd])();
        local_59 = false;
        if ((Generator *)CONCAT44(extraout_var,iVar3) != context) {
          VVar2 = Var::type(var);
          local_59 = false;
          if (VVar2 != PortIO) {
            VVar2 = Var::type(var);
            local_59 = VVar2 != ConstValue;
          }
        }
        context_local._7_1_ = local_59;
      }
    }
  }
  return context_local._7_1_;
}

Assistant:

static bool has_non_port(Generator* context, Var* var) {
        if (!var) return false;
        if (var->type() == VarType::Expression) {
            auto* expr = dynamic_cast<Expr*>(var);
            return has_non_port(context, expr->left) || has_non_port(context, expr->right);
        } else if (var->type() == VarType::Slice) {
            auto* slice = dynamic_cast<VarSlice*>(var);
            return has_non_port(context, slice->parent_var);
        } else {
            return var->generator() != context && var->type() != VarType::PortIO &&
                   var->type() != VarType ::ConstValue;
        }
    }